

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O0

bool __thiscall
slang::ast::ElementSelectExpression::isConstantSelect
          (ElementSelectExpression *this,EvalContext *context)

{
  bool bVar1;
  bool bVar2;
  ElementSelectExpression *in_RDI;
  Type *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  byte local_55;
  byte local_1;
  
  value(in_RDI);
  not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xbe3cc9);
  bVar1 = Type::hasFixedRange(in_stack_ffffffffffffff90);
  local_55 = 0;
  if (bVar1) {
    selector(in_RDI);
    Expression::eval((Expression *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
                     (EvalContext *)&stack0xffffffffffffffc0);
    bVar2 = slang::ConstantValue::bad((ConstantValue *)0xbe3d15);
    local_55 = bVar2 ^ 0xff;
  }
  local_1 = local_55 & 1;
  if (bVar1) {
    slang::ConstantValue::~ConstantValue((ConstantValue *)0xbe3d42);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool ElementSelectExpression::isConstantSelect(EvalContext& context) const {
    return value().type->hasFixedRange() && !selector().eval(context).bad();
}